

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

void nn_sws_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  nn_sws *sws;
  nn_fsm_owner *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  long local_28;
  
  local_28 = in_RDI;
  if (in_RDI == 0) {
    local_28 = 0;
  }
  if (in_ESI == 0xfffffffe && in_EDX == 0xfffffffd) {
    nn_pipebase_stop((nn_pipebase *)0x148d88);
    nn_ws_handshake_stop((nn_ws_handshake *)0x148d96);
    *(undefined4 *)(local_28 + 0x58) = 8;
  }
  if (*(int *)(local_28 + 0x58) == 8) {
    iVar1 = nn_ws_handshake_isidle((nn_ws_handshake *)0x148dc9);
    if (iVar1 != 0) {
      nn_usock_swap_owner((nn_usock *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
      *(undefined8 *)(local_28 + 0x68) = 0;
      *(undefined4 *)(local_28 + 0x1528) = 0xffffffff;
      *(undefined8 *)(local_28 + 0x1530) = 0;
      *(undefined4 *)(local_28 + 0x58) = 1;
      nn_fsm_stopped((nn_fsm *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    }
    return;
  }
  nn_backtrace_print();
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
          (ulong)*(uint *)(local_28 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
          ,0x362);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_sws_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_sws *sws;

    sws = nn_cont (self, struct nn_sws, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        /*  TODO: Consider sending a close code here? */
        nn_pipebase_stop (&sws->pipebase);
        nn_ws_handshake_stop (&sws->handshaker);
        sws->state = NN_SWS_STATE_STOPPING;
    }
    if (nn_slow (sws->state == NN_SWS_STATE_STOPPING)) {
        if (nn_ws_handshake_isidle (&sws->handshaker)) {
            nn_usock_swap_owner (sws->usock, &sws->usock_owner);
            sws->usock = NULL;
            sws->usock_owner.src = -1;
            sws->usock_owner.fsm = NULL;
            sws->state = NN_SWS_STATE_IDLE;
            nn_fsm_stopped (&sws->fsm, NN_SWS_RETURN_STOPPED);
            return;
        }
        return;
    }

    nn_fsm_bad_state (sws->state, src, type);
}